

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareSin2Distances<double>
              (Vector3<double> *x,Vector3<double> *a,Vector3<double> *b)

{
  double dVar1;
  double dVar2;
  int local_54;
  double error;
  double diff;
  double sin2_bx;
  double sin2_ax;
  double sin2_bx_error;
  double sin2_ax_error;
  Vector3<double> *b_local;
  Vector3<double> *a_local;
  Vector3<double> *x_local;
  
  sin2_ax_error = (double)b;
  b_local = a;
  a_local = x;
  dVar1 = GetSin2Distance(a,x,&sin2_bx_error);
  dVar2 = GetSin2Distance((S2Point *)sin2_ax_error,a_local,&sin2_ax);
  if (dVar1 - dVar2 <= sin2_bx_error + sin2_ax) {
    local_54 = 0;
    if (dVar1 - dVar2 < -(sin2_bx_error + sin2_ax)) {
      local_54 = -1;
    }
  }
  else {
    local_54 = 1;
  }
  return local_54;
}

Assistant:

int TriageCompareSin2Distances(const Vector3<T>& x,
                               const Vector3<T>& a, const Vector3<T>& b) {
  T sin2_ax_error, sin2_bx_error;
  T sin2_ax = GetSin2Distance(a, x, &sin2_ax_error);
  T sin2_bx = GetSin2Distance(b, x, &sin2_bx_error);
  T diff = sin2_ax - sin2_bx;
  T error = sin2_ax_error + sin2_bx_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}